

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O0

void pbrt::detail::stringPrintfRecursive(string *s,char *fmt)

{
  char *in_RSI;
  string *in_RDI;
  char *c;
  char *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  LogLevel in_stack_000000a4;
  char *local_18;
  
  local_18 = in_RSI;
  do {
    if (*local_18 == '\0') {
      return;
    }
    if (*local_18 == '%') {
      if (local_18[1] != '%') {
        LogFatal(in_stack_000000a4,in_stack_00000098,in_stack_00000094,in_stack_00000088);
      }
      local_18 = local_18 + 1;
    }
    std::__cxx11::string::operator+=(in_RDI,*local_18);
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void stringPrintfRecursive(std::string *s, const char *fmt) {
    const char *c = fmt;
    // No args left; make sure there aren't any extra formatting
    // specifiers.
    while (*c) {
        if (*c == '%') {
            if (c[1] != '%')
                LOG_FATAL("Not enough optional values passed to Printf.");
            ++c;
        }
        *s += *c++;
    }
}